

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O1

void __thiscall
cbtIDebugDraw::drawCylinder
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar halfHeight,int upAxis,
          cbtTransform *transform,cbtVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint uVar17;
  cbtVector3 *pcVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int local_f0;
  undefined1 local_c8 [8];
  uint uStack_c0;
  undefined1 local_b8 [8];
  uint uStack_b0;
  undefined1 local_a8 [8];
  uint uStack_a0;
  undefined1 local_98 [8];
  uint uStack_90;
  cbtVector3 *local_80;
  undefined1 local_78 [8];
  uint uStack_70;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  auVar31._4_60_ = in_register_00001244;
  auVar31._0_4_ = halfHeight;
  fVar1 = (transform->m_origin).m_floats[0];
  fVar2 = (transform->m_origin).m_floats[1];
  fVar3 = (transform->m_origin).m_floats[2];
  lVar26 = (long)upAxis;
  _local_a8 = ZEXT812(0);
  register0x0000120c = 0;
  _local_78 = _local_a8;
  *(cbtScalar *)(local_78 + lVar26 * 4) = halfHeight;
  auVar28._8_4_ = 0x80000000;
  auVar28._0_8_ = 0x8000000080000000;
  auVar28._12_4_ = 0x80000000;
  auVar28 = vxorps_avx512vl(auVar31._0_16_,auVar28);
  _local_98 = _local_a8;
  local_80 = color;
  *(int *)(local_98 + lVar26 * 4) = auVar28._0_4_;
  *(cbtScalar *)(local_a8 + lVar26 * 4) = halfHeight;
  iVar22 = upAxis + 1;
  iVar23 = (int)((long)iVar22 / 3 + ((long)iVar22 >> 0x3f));
  lVar25 = (long)(upAxis + 1 + (iVar23 - (iVar22 >> 0x1f)) * -3);
  lVar24 = (long)(upAxis + 2 + ((upAxis + 2) / 3) * -3);
  uVar27 = 0xffffffe2;
  do {
    uVar27 = uVar27 + 0x1e;
    fVar29 = sinf((float)(int)uVar27 * 0.017453292);
    *(float *)(local_98 + lVar25 * 4) = fVar29 * radius;
    *(float *)(local_a8 + lVar25 * 4) = fVar29 * radius;
    fVar29 = cosf((float)(int)uVar27 * 0.017453292);
    *(float *)(local_98 + lVar24 * 4) = fVar29 * radius;
    *(float *)(local_a8 + lVar24 * 4) = fVar29 * radius;
    fVar29 = (transform->m_basis).m_el[0].m_floats[1];
    auVar30 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (float)local_98._4_4_)),auVar30,
                              ZEXT416((uint)local_98._0_4_));
    auVar33 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
    auVar28 = vfmadd231ss_fma(auVar28,auVar33,ZEXT416(uStack_90));
    fVar4 = (transform->m_basis).m_el[1].m_floats[1];
    auVar35 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_98._4_4_)),auVar35,
                              ZEXT416((uint)local_98._0_4_));
    auVar36 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
    auVar12 = vfmadd231ss_fma(auVar12,auVar36,ZEXT416(uStack_90));
    fVar5 = (transform->m_basis).m_el[2].m_floats[1];
    auVar37 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
    auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_98._4_4_)),auVar37,
                              ZEXT416((uint)local_98._0_4_));
    auVar32 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
    auVar34 = vfmadd231ss_fma(auVar34,auVar32,ZEXT416(uStack_90));
    auVar28 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar28._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar12._0_4_)),0x10);
    _local_b8 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar3 + auVar34._0_4_)),0x28);
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (float)local_a8._4_4_)),
                              ZEXT416((uint)local_a8._0_4_),auVar30);
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416(uStack_a0),auVar33);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_a8._4_4_)),
                              ZEXT416((uint)local_a8._0_4_),auVar35);
    auVar12 = vfmadd231ss_fma(auVar12,ZEXT416(uStack_a0),auVar36);
    auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_a8._4_4_)),auVar37,
                              ZEXT416((uint)local_a8._0_4_));
    auVar34 = vfmadd231ss_fma(auVar34,auVar32,ZEXT416(uStack_a0));
    auVar28 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar28._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar12._0_4_)),0x10);
    _local_c8 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar3 + auVar34._0_4_)),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,local_b8,local_c8,local_80);
  } while (uVar27 < 0x14a);
  _local_b8 = ZEXT816(0);
  *(undefined4 *)(local_b8 + lVar26 * 4) = 0x3f800000;
  _local_c8 = ZEXT816(0);
  *(undefined4 *)(local_c8 + (long)(iVar22 + (iVar23 - (iVar22 >> 0x1f)) * -3) * 4) = 0x3f800000;
  pcVar18 = local_80;
  cVar6 = (transform->m_basis).m_el[0].m_floats[0];
  fVar29 = (transform->m_basis).m_el[0].m_floats[1];
  uVar19 = local_78._0_4_;
  uVar20 = local_78._4_4_;
  auVar34 = ZEXT416((uint)local_78._0_4_);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._4_4_ * fVar29)),ZEXT416((uint)cVar6),
                            auVar34);
  cVar7 = (transform->m_basis).m_el[0].m_floats[2];
  uVar21 = uStack_70;
  auVar30 = ZEXT416(uStack_70);
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar7),auVar30);
  cVar8 = (transform->m_basis).m_el[1].m_floats[0];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._4_4_ * fVar4)),ZEXT416((uint)cVar8),
                            auVar34);
  cVar9 = (transform->m_basis).m_el[1].m_floats[2];
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar9),auVar30);
  cVar10 = (transform->m_basis).m_el[2].m_floats[0];
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)((float)local_78._4_4_ * fVar5)),ZEXT416((uint)cVar10),
                            auVar34);
  cVar11 = (transform->m_basis).m_el[2].m_floats[2];
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar11),auVar30);
  auVar28 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar28._0_4_)),
                          ZEXT416((uint)(fVar2 - auVar12._0_4_)),0x10);
  local_40 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar3 - auVar34._0_4_)),0x28);
  uVar15 = local_b8._0_4_;
  uVar16 = local_b8._4_4_;
  auVar30 = ZEXT416((uint)local_b8._0_4_);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)local_b8._4_4_ * fVar29)),ZEXT416((uint)cVar6),
                            auVar30);
  uVar17 = uStack_b0;
  auVar34 = ZEXT416(uStack_b0);
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar7),auVar34);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((float)local_b8._4_4_ * fVar4)),ZEXT416((uint)cVar8),
                            auVar30);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar9),auVar34);
  auVar28 = vinsertps_avx(auVar28,auVar12,0x10);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_b8._4_4_)),ZEXT416((uint)cVar10),
                            auVar30);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar11),auVar34);
  local_50 = vinsertps_avx(auVar28,auVar12,0x28);
  uVar13 = local_c8._0_4_;
  uVar14 = local_c8._4_4_;
  auVar30 = ZEXT416((uint)local_c8._0_4_);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (float)local_c8._4_4_)),auVar30,
                            ZEXT416((uint)cVar6));
  uVar27 = uStack_c0;
  auVar34 = ZEXT416(uStack_c0);
  auVar28 = vfmadd231ss_fma(auVar28,auVar34,ZEXT416((uint)cVar7));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_c8._4_4_)),auVar30,
                            ZEXT416((uint)cVar8));
  auVar12 = vfmadd231ss_fma(auVar12,auVar34,ZEXT416((uint)cVar9));
  auVar28 = vinsertps_avx(auVar28,auVar12,0x10);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_c8._4_4_)),auVar30,
                            ZEXT416((uint)cVar10));
  auVar12 = vfmadd231ss_fma(auVar12,auVar34,ZEXT416((uint)cVar11));
  local_60 = vinsertps_avx(auVar28,auVar12,0x28);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this,local_40,local_50,local_60,local_80,0);
  cVar6 = (transform->m_basis).m_el[0].m_floats[0];
  fVar29 = (transform->m_basis).m_el[0].m_floats[1];
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar29)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)uVar19));
  cVar7 = (transform->m_basis).m_el[0].m_floats[2];
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar7),ZEXT416(uVar21));
  cVar8 = (transform->m_basis).m_el[1].m_floats[0];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar4)),ZEXT416((uint)cVar8),
                            ZEXT416((uint)uVar19));
  cVar9 = (transform->m_basis).m_el[1].m_floats[2];
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar9),ZEXT416(uVar21));
  cVar10 = (transform->m_basis).m_el[2].m_floats[0];
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar5)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)uVar19));
  cVar11 = (transform->m_basis).m_el[2].m_floats[2];
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar11),ZEXT416(uVar21));
  auVar28 = vinsertps_avx(ZEXT416((uint)(auVar28._0_4_ + fVar1)),
                          ZEXT416((uint)(auVar12._0_4_ + fVar2)),0x10);
  local_40 = vinsertps_avx(auVar28,ZEXT416((uint)(auVar34._0_4_ + fVar3)),0x28);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar16 * fVar29)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)uVar15));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar7),ZEXT416(uVar17));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar16 * fVar4)),ZEXT416((uint)cVar8),
                            ZEXT416((uint)uVar15));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar9),ZEXT416(uVar17));
  auVar28 = vinsertps_avx(auVar28,auVar12,0x10);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar16 * fVar5)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)uVar15));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar11),ZEXT416(uVar17));
  local_50 = vinsertps_avx(auVar28,auVar12,0x28);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar14 * fVar29)),ZEXT416((uint)uVar13),
                            ZEXT416((uint)cVar6));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416(uVar27),ZEXT416((uint)cVar7));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar14 * fVar4)),ZEXT416((uint)uVar13),
                            ZEXT416((uint)cVar8));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416(uVar27),ZEXT416((uint)cVar9));
  auVar28 = vinsertps_avx(auVar28,auVar12,0x10);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)uVar14)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)uVar13));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar11),ZEXT416(uVar27));
  local_60 = vinsertps_avx(auVar28,auVar12,0x28);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this,local_40,local_50,local_60,pcVar18,0);
  return;
}

Assistant:

virtual void drawCylinder(cbtScalar radius, cbtScalar halfHeight, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		cbtVector3 start = transform.getOrigin();
		cbtVector3 offsetHeight(0, 0, 0);
		offsetHeight[upAxis] = halfHeight;
		int stepDegrees = 30;
		cbtVector3 capStart(0.f, 0.f, 0.f);
		capStart[upAxis] = -halfHeight;
		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = halfHeight;

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = capStart[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = capStart[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * capStart, start + transform.getBasis() * capEnd, color);
		}
		// Drawing top and bottom caps of the cylinder
		cbtVector3 yaxis(0, 0, 0);
		yaxis[upAxis] = cbtScalar(1.0);
		cbtVector3 xaxis(0, 0, 0);
		xaxis[(upAxis + 1) % 3] = cbtScalar(1.0);
		drawArc(start - transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, cbtScalar(10.0));
		drawArc(start + transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, cbtScalar(10.0));
	}